

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

ExceptionOr<capnp::Response<capnp::Persistent<capnp::Text,_capnp::AnyPointer>::SaveResults>_> *
__thiscall
kj::_::ExceptionOr<capnp::Response<capnp::Persistent<capnp::Text,_capnp::AnyPointer>::SaveResults>_>
::operator=(ExceptionOr<capnp::Response<capnp::Persistent<capnp::Text,_capnp::AnyPointer>::SaveResults>_>
            *this,ExceptionOr<capnp::Response<capnp::Persistent<capnp::Text,_capnp::AnyPointer>::SaveResults>_>
                  *param_1)

{
  ExceptionOr<capnp::Response<capnp::Persistent<capnp::Text,_capnp::AnyPointer>::SaveResults>_>
  *param_1_local;
  ExceptionOr<capnp::Response<capnp::Persistent<capnp::Text,_capnp::AnyPointer>::SaveResults>_>
  *this_local;
  
  ExceptionOrValue::operator=(&this->super_ExceptionOrValue,&param_1->super_ExceptionOrValue);
  Maybe<capnp::Response<capnp::Persistent<capnp::Text,_capnp::AnyPointer>::SaveResults>_>::operator=
            (&this->value,&param_1->value);
  return this;
}

Assistant:

ExceptionOr& operator=(ExceptionOr&&) = default;